

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,OPJ_BYTE *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size
                          ,opj_event_mgr_t *p_manager)

{
  uint local_6c;
  OPJ_UINT32 bytes_to_read;
  OPJ_BYTE *orig_header_data;
  ushort local_58;
  ushort local_56;
  OPJ_UINT32 l_value;
  OPJ_UINT16 j;
  OPJ_UINT16 i;
  OPJ_UINT16 nr_channels;
  OPJ_UINT16 nr_entries;
  OPJ_UINT32 *entries;
  OPJ_BYTE *channel_sign;
  OPJ_BYTE *channel_size;
  opj_jp2_pclr_t *jp2_pclr;
  opj_event_mgr_t *p_manager_local;
  OPJ_BYTE *pOStack_20;
  OPJ_UINT32 p_pclr_header_size_local;
  OPJ_BYTE *p_pclr_header_data_local;
  opj_jp2_t *jp2_local;
  
  jp2_pclr = (opj_jp2_pclr_t *)p_manager;
  p_manager_local._4_4_ = p_pclr_header_size;
  pOStack_20 = p_pclr_header_data;
  p_pclr_header_data_local = (OPJ_BYTE *)jp2;
  if (p_pclr_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_pclr_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x489,
                  "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x48b,
                    "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if ((jp2->color).jp2_pclr == (opj_jp2_pclr_t *)0x0) {
      if (p_pclr_header_size < 3) {
        jp2_local._4_4_ = 0;
      }
      else {
        opj_read_bytes_LE(p_pclr_header_data,(OPJ_UINT32 *)((long)&orig_header_data + 4),2);
        pOStack_20 = pOStack_20 + 2;
        l_value._2_2_ = (ushort)orig_header_data._4_4_;
        if ((l_value._2_2_ == 0) || (0x400 < l_value._2_2_)) {
          opj_event_msg((opj_event_mgr_t *)jp2_pclr,1,"Invalid PCLR box. Reports %d entries\n",
                        (ulong)l_value._2_2_);
          jp2_local._4_4_ = 0;
        }
        else {
          opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&orig_header_data + 4),1);
          pOStack_20 = pOStack_20 + 1;
          l_value._0_2_ = (ushort)orig_header_data._4_4_;
          if ((ushort)l_value == 0) {
            opj_event_msg((opj_event_mgr_t *)jp2_pclr,1,
                          "Invalid PCLR box. Reports 0 palette columns\n");
            jp2_local._4_4_ = 0;
          }
          else if (p_manager_local._4_4_ < (orig_header_data._4_4_ & 0xffff) + 3) {
            jp2_local._4_4_ = 0;
          }
          else {
            _j = (uint *)opj_malloc((ulong)(ushort)l_value * 4 * (ulong)l_value._2_2_);
            if (_j == (uint *)0x0) {
              jp2_local._4_4_ = 0;
            }
            else {
              channel_sign = (OPJ_BYTE *)opj_malloc((ulong)(ushort)l_value);
              if (channel_sign == (OPJ_BYTE *)0x0) {
                opj_free(_j);
                jp2_local._4_4_ = 0;
              }
              else {
                entries = (OPJ_UINT32 *)opj_malloc((ulong)(ushort)l_value);
                if (entries == (OPJ_UINT32 *)0x0) {
                  opj_free(_j);
                  opj_free(channel_sign);
                  jp2_local._4_4_ = 0;
                }
                else {
                  channel_size = (OPJ_BYTE *)opj_malloc(0x28);
                  if (channel_size == (OPJ_BYTE *)0x0) {
                    opj_free(_j);
                    opj_free(channel_sign);
                    opj_free(entries);
                    jp2_local._4_4_ = 0;
                  }
                  else {
                    *(OPJ_UINT32 **)(channel_size + 8) = entries;
                    *(OPJ_BYTE **)(channel_size + 0x10) = channel_sign;
                    *(uint **)channel_size = _j;
                    *(ushort *)(channel_size + 0x20) = l_value._2_2_;
                    channel_size[0x22] = (OPJ_BYTE)orig_header_data._4_4_;
                    channel_size[0x18] = '\0';
                    channel_size[0x19] = '\0';
                    channel_size[0x1a] = '\0';
                    channel_size[0x1b] = '\0';
                    channel_size[0x1c] = '\0';
                    channel_size[0x1d] = '\0';
                    channel_size[0x1e] = '\0';
                    channel_size[0x1f] = '\0';
                    *(OPJ_BYTE **)(p_pclr_header_data_local + 0x98) = channel_size;
                    for (local_56 = 0; local_56 < (ushort)l_value; local_56 = local_56 + 1) {
                      opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&orig_header_data + 4),1);
                      pOStack_20 = pOStack_20 + 1;
                      channel_sign[local_56] = ((byte)orig_header_data._4_4_ & 0x7f) + 1;
                      *(bool *)((long)entries + (ulong)local_56) =
                           (orig_header_data._4_4_ & 0x80) != 0;
                    }
                    for (local_58 = 0; local_58 < l_value._2_2_; local_58 = local_58 + 1) {
                      for (local_56 = 0; local_56 < (ushort)l_value; local_56 = local_56 + 1) {
                        local_6c = (int)(channel_sign[local_56] + 7) >> 3;
                        if (4 < local_6c) {
                          local_6c = 4;
                        }
                        if ((long)(ulong)p_manager_local._4_4_ <
                            (long)(pOStack_20 + ((ulong)local_6c - (long)p_pclr_header_data))) {
                          return 0;
                        }
                        opj_read_bytes_LE(pOStack_20,(OPJ_UINT32 *)((long)&orig_header_data + 4),
                                          local_6c);
                        pOStack_20 = pOStack_20 + local_6c;
                        *_j = orig_header_data._4_4_;
                        _j = _j + 1;
                      }
                    }
                    jp2_local._4_4_ = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      jp2_local._4_4_ = 0;
    }
    return jp2_local._4_4_;
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x48a,
                "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_pclr_header_data,
                                  OPJ_UINT32 p_pclr_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_pclr_t *jp2_pclr;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    OPJ_UINT16 nr_entries, nr_channels;
    OPJ_UINT16 i, j;
    OPJ_UINT32 l_value;
    OPJ_BYTE *orig_header_data = p_pclr_header_data;

    /* preconditions */
    assert(p_pclr_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);
    (void)p_pclr_header_size;

    if (jp2->color.jp2_pclr) {
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3) {
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 2);    /* NE */
    p_pclr_header_data += 2;
    nr_entries = (OPJ_UINT16) l_value;
    if ((nr_entries == 0U) || (nr_entries > 1024U)) {
        opj_event_msg(p_manager, EVT_ERROR, "Invalid PCLR box. Reports %d entries\n",
                      (int)nr_entries);
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* NPC */
    ++p_pclr_header_data;
    nr_channels = (OPJ_UINT16) l_value;
    if (nr_channels == 0U) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid PCLR box. Reports 0 palette columns\n");
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3 + (OPJ_UINT32)nr_channels) {
        return OPJ_FALSE;
    }

    entries = (OPJ_UINT32*) opj_malloc(sizeof(OPJ_UINT32) * nr_channels *
                                       nr_entries);
    if (!entries) {
        return OPJ_FALSE;
    }
    channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_size) {
        opj_free(entries);
        return OPJ_FALSE;
    }
    channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_sign) {
        opj_free(entries);
        opj_free(channel_size);
        return OPJ_FALSE;
    }

    jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
    if (!jp2_pclr) {
        opj_free(entries);
        opj_free(channel_size);
        opj_free(channel_sign);
        return OPJ_FALSE;
    }

    jp2_pclr->channel_sign = channel_sign;
    jp2_pclr->channel_size = channel_size;
    jp2_pclr->entries = entries;
    jp2_pclr->nr_entries = nr_entries;
    jp2_pclr->nr_channels = (OPJ_BYTE) l_value;
    jp2_pclr->cmap = NULL;

    jp2->color.jp2_pclr = jp2_pclr;

    for (i = 0; i < nr_channels; ++i) {
        opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* Bi */
        ++p_pclr_header_data;

        channel_size[i] = (OPJ_BYTE)((l_value & 0x7f) + 1);
        channel_sign[i] = (l_value & 0x80) ? 1 : 0;
    }

    for (j = 0; j < nr_entries; ++j) {
        for (i = 0; i < nr_channels; ++i) {
            OPJ_UINT32 bytes_to_read = (OPJ_UINT32)((channel_size[i] + 7) >> 3);

            if (bytes_to_read > sizeof(OPJ_UINT32)) {
                bytes_to_read = sizeof(OPJ_UINT32);
            }
            if ((ptrdiff_t)p_pclr_header_size < (ptrdiff_t)(p_pclr_header_data -
                    orig_header_data) + (ptrdiff_t)bytes_to_read) {
                return OPJ_FALSE;
            }

            opj_read_bytes(p_pclr_header_data, &l_value, bytes_to_read);    /* Cji */
            p_pclr_header_data += bytes_to_read;
            *entries = (OPJ_UINT32) l_value;
            entries++;
        }
    }

    return OPJ_TRUE;
}